

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

Boxed_Value
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::buildInt(int base,string_view t_val,bool prefixed)

{
  out_of_range *poVar1;
  int iVar2;
  uint uVar3;
  const_reference pvVar4;
  out_of_range *poVar5;
  long lVar6;
  out_of_range *poVar7;
  longlong lVar8;
  undefined7 in_register_00000009;
  undefined4 in_register_0000003c;
  element_type *this;
  byte in_R8B;
  Boxed_Value BVar10;
  out_of_range *anon_var_0_1;
  unsigned_long_long u_1;
  out_of_range *anon_var_0;
  out_of_range *local_98;
  out_of_range *local_90;
  out_of_range *local_88;
  uint local_7c;
  int local_78 [5];
  allocator<char> local_61;
  string local_60;
  out_of_range *local_40;
  longlong u;
  size_type sStack_30;
  char val;
  size_type i;
  bool longlong_;
  bool long_;
  bool unsigned_;
  bool prefixed_local;
  int base_local;
  string_view t_val_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  
  this = (element_type *)CONCAT44(in_register_0000003c,base);
  t_val_local._M_len = CONCAT71(in_register_00000009,prefixed);
  _longlong_ = t_val._M_str;
  i._4_4_ = (int)t_val._M_len;
  i._3_1_ = in_R8B & 1;
  i._2_1_ = 0;
  i._1_1_ = 0;
  i._0_1_ = 0;
  t_val_local._M_str = (char *)this;
  for (sStack_30 = Catch::clara::std::basic_string_view<char,_std::char_traits<char>_>::size
                             ((basic_string_view<char,_std::char_traits<char>_> *)&longlong_);
      sStack_30 != 0; sStack_30 = sStack_30 - 1) {
    pvVar4 = Catch::clara::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)&longlong_,sStack_30 - 1
                       );
    u._7_1_ = *pvVar4;
    if ((u._7_1_ == 'u') || (u._7_1_ == 'U')) {
      i._2_1_ = 1;
    }
    else {
      if ((u._7_1_ != 'l') && (u._7_1_ != 'L')) break;
      if ((i._1_1_ & 1) != 0) {
        i._0_1_ = 1;
      }
      i._1_1_ = 1;
    }
  }
  if ((i._3_1_ & 1) != 0) {
    Catch::clara::std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)&longlong_,2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_60,(basic_string_view<char,_std::char_traits<char>_> *)&longlong_,
             &local_61);
  poVar5 = (out_of_range *)Catch::clara::std::__cxx11::stoll(&local_60,(size_t *)0x0,i._4_4_);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_40 = poVar5;
  if (((((i._2_1_ & 1) == 0) && ((i._1_1_ & 1) == 0)) &&
      (iVar2 = Catch::clara::std::numeric_limits<int>::min(), poVar1 = local_40,
      (long)iVar2 <= (long)poVar5)) &&
     (iVar2 = Catch::clara::std::numeric_limits<int>::max(), (long)poVar1 <= (long)iVar2)) {
    local_78[0] = (uint)local_40;
    BVar10 = const_var<int>((chaiscript *)this,local_78);
    _Var9._M_pi = BVar10.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else {
    poVar5 = local_40;
    if ((((i._2_1_ & 1) == 0) && (i._4_4_ == 10)) ||
       (((i._1_1_ & 1) != 0 ||
        ((uVar3 = Catch::clara::std::numeric_limits<unsigned_int>::min(), poVar1 = local_40,
         (long)poVar5 < (long)(ulong)uVar3 ||
         (uVar3 = Catch::clara::std::numeric_limits<unsigned_int>::max(),
         (long)(ulong)uVar3 < (long)poVar1)))))) {
      poVar5 = local_40;
      if (((((i._2_1_ & 1) == 0) && (((byte)i & 1) == 0)) &&
          (lVar6 = Catch::clara::std::numeric_limits<long>::min(), poVar1 = local_40,
          lVar6 <= (long)poVar5)) &&
         (lVar6 = Catch::clara::std::numeric_limits<long>::max(), (long)poVar1 <= lVar6)) {
        local_88 = local_40;
        BVar10 = const_var<long>((chaiscript *)this,(long *)&local_88);
        _Var9._M_pi = BVar10.m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
      else {
        poVar5 = local_40;
        if ((((i._2_1_ & 1) == 0) && (i._4_4_ == 10)) ||
           ((((byte)i & 1) != 0 ||
            ((poVar7 = (out_of_range *)Catch::clara::std::numeric_limits<unsigned_long>::min(),
             poVar1 = local_40, poVar5 < poVar7 ||
             (poVar5 = (out_of_range *)Catch::clara::std::numeric_limits<unsigned_long>::max(),
             poVar5 < poVar1)))))) {
          poVar5 = local_40;
          if ((((i._2_1_ & 1) == 0) &&
              (lVar8 = Catch::clara::std::numeric_limits<long_long>::min(), poVar1 = local_40,
              lVar8 <= (long)poVar5)) &&
             (lVar8 = Catch::clara::std::numeric_limits<long_long>::max(), (long)poVar1 <= lVar8)) {
            local_98 = local_40;
            BVar10 = const_var<long_long>((chaiscript *)this,(longlong *)&local_98);
            _Var9._M_pi = BVar10.m_data.
                          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
          }
          else {
            anon_var_0 = local_40;
            BVar10 = const_var<unsigned_long_long>
                               ((chaiscript *)this,(unsigned_long_long *)&anon_var_0);
            _Var9._M_pi = BVar10.m_data.
                          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
          }
        }
        else {
          local_90 = local_40;
          BVar10 = const_var<unsigned_long>((chaiscript *)this,(unsigned_long *)&local_90);
          _Var9._M_pi = BVar10.m_data.
                        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
        }
      }
    }
    else {
      local_7c = (uint)local_40;
      BVar10 = const_var<unsigned_int>((chaiscript *)this,&local_7c);
      _Var9._M_pi = BVar10.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
    }
  }
  BVar10.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var9._M_pi;
  BVar10.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = this;
  return (Boxed_Value)
         BVar10.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static Boxed_Value buildInt(const int base, std::string_view t_val, const bool prefixed) {
        bool unsigned_ = false;
        bool long_ = false;
        bool longlong_ = false;

        auto i = t_val.size();

        for (; i > 0; --i) {
          const char val = t_val[i - 1];

          if (val == 'u' || val == 'U') {
            unsigned_ = true;
          } else if (val == 'l' || val == 'L') {
            if (long_) {
              longlong_ = true;
            }

            long_ = true;
          } else {
            break;
          }
        }

        if (prefixed) {
          t_val.remove_prefix(2);
        }

#ifdef __GNUC__
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wsign-compare"

#ifdef CHAISCRIPT_CLANG
#pragma GCC diagnostic ignored "-Wtautological-compare"
#pragma GCC diagnostic ignored "-Wtautological-unsigned-zero-compare"
#pragma GCC diagnostic ignored "-Wtautological-type-limit-compare"
#pragma GCC diagnostic ignored "-Wsign-conversion"
#endif

#endif

        try {
          /// TODO fix this to use from_chars
          auto u = std::stoll(std::string(t_val), nullptr, base);

          if (!unsigned_ && !long_ && u >= std::numeric_limits<int>::min() && u <= std::numeric_limits<int>::max()) {
            return const_var(static_cast<int>(u));
          } else if ((unsigned_ || base != 10) && !long_ && u >= std::numeric_limits<unsigned int>::min()
                     && u <= std::numeric_limits<unsigned int>::max()) {
            return const_var(static_cast<unsigned int>(u));
          } else if (!unsigned_ && !longlong_ && u >= std::numeric_limits<long>::min() && u <= std::numeric_limits<long>::max()) {
            return const_var(static_cast<long>(u));
          } else if ((unsigned_ || base != 10) && !longlong_ && u >= std::numeric_limits<unsigned long>::min()
                     && u <= std::numeric_limits<unsigned long>::max()) {
            return const_var(static_cast<unsigned long>(u));
          } else if (!unsigned_ && u >= std::numeric_limits<long long>::min() && u <= std::numeric_limits<long long>::max()) {
            return const_var(static_cast<long long>(u));
          } else {
            return const_var(static_cast<unsigned long long>(u));
          }

        } catch (const std::out_of_range &) {
          // too big to be signed
          try {
            /// TODO fix this to use from_chars
            auto u = std::stoull(std::string(t_val), nullptr, base);

            if (!longlong_ && u >= std::numeric_limits<unsigned long>::min() && u <= std::numeric_limits<unsigned long>::max()) {
              return const_var(static_cast<unsigned long>(u));
            } else {
              return const_var(static_cast<unsigned long long>(u));
            }
          } catch (const std::out_of_range &) {
            // it's just simply too big
            return const_var(std::numeric_limits<long long>::max());
          }
        }

#ifdef __GNUC__
#pragma GCC diagnostic pop
#endif
      }